

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructurePattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructurePattern,std::span<slang::ast::StructurePattern::FieldPattern,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  SourceRange sourceRange;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> patterns;
  StructurePattern *pSVar1;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
  *in_stack_ffffffffffffffc8;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
  *in_stack_ffffffffffffffd0;
  SourceLocation in_stack_ffffffffffffffd8;
  SourceLocation in_stack_ffffffffffffffe0;
  
  pSVar1 = (StructurePattern *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>::
  span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  patterns._M_extent._M_extent_value = in_RSI._M_extent_value;
  patterns._M_ptr = in_RDX;
  sourceRange.endLoc = in_stack_ffffffffffffffe0;
  sourceRange.startLoc = in_stack_ffffffffffffffd8;
  ast::StructurePattern::StructurePattern
            ((StructurePattern *)(in_RDX->pattern).ptr,patterns,sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }